

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void PrintMiscActorInfo(AActor *query)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FLineSpecial *pFVar5;
  char *pcVar6;
  uint uVar7;
  int style;
  ulong uVar8;
  double dVar9;
  
  if (query == (AActor *)0x0) {
    return;
  }
  uVar8 = 0;
  do {
    if (LegacyRenderStyles[uVar8].AsDWORD == (query->RenderStyle).AsDWORD) goto LAB_0042bcc5;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0xe);
  uVar8 = 0xe;
LAB_0042bcc5:
  pFVar5 = P_GetLineSpecialInfo(query->special);
  pcVar6 = AActor::GetTag(query,(char *)0x0);
  Printf("%s @ %p has the following flags:\n   flags: %x",pcVar6,query,(ulong)(query->flags).Value);
  uVar7 = 0;
  do {
    if (((query->flags).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1bc);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags2: %x",(ulong)(query->flags2).Value);
  uVar7 = 0;
  do {
    if (((query->flags2).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1c0);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags3: %x",(ulong)(query->flags3).Value);
  uVar7 = 0;
  do {
    if (((query->flags3).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1c4);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags4: %x",(ulong)(query->flags4).Value);
  uVar7 = 0;
  do {
    if (((query->flags4).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1c8);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags5: %x",(ulong)(query->flags5).Value);
  uVar7 = 0;
  do {
    if (((query->flags5).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1cc);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags6: %x",(ulong)(query->flags6).Value);
  uVar7 = 0;
  do {
    if (((query->flags6).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1d0);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\n   flags7: %x",(ulong)(query->flags7).Value);
  uVar7 = 0;
  do {
    if (((query->flags7).Value >> (uVar7 & 0x1f) & 1) != 0) {
      pcVar6 = GetFlagName(1 << ((byte)uVar7 & 0x1f),0x1d4);
      Printf(" %s",pcVar6);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f",query->bouncefactor,
         query->wallbouncefactor,(ulong)(query->BounceFlags).Value);
  if ((uint)uVar8 < 0xe) {
    pcVar6 = _ZZ18PrintMiscActorInfoP6AActorE12renderstyles_rel +
             *(int *)(_ZZ18PrintMiscActorInfoP6AActorE12renderstyles_rel + (uVar8 & 0xffffffff) * 4)
    ;
  }
  else {
    pcVar6 = "Unknown";
  }
  Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x",query->Alpha,uVar8 & 0xffffffff,pcVar6
         ,(ulong)(query->renderflags).Value);
  if (pFVar5 == (FLineSpecial *)0x0) {
    pcVar6 = "None";
  }
  else {
    pcVar6 = pFVar5->name;
  }
  Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",pcVar6,
         (ulong)(uint)query->args[0],(ulong)(uint)query->args[1],(ulong)(uint)query->args[2],
         (ulong)(uint)query->args[3],(ulong)(uint)query->args[4],(ulong)(uint)query->special1,
         (ulong)(uint)query->special2);
  Printf("\nTID: %d",(ulong)(uint)query->tid);
  Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",(query->__Pos).X,(query->__Pos).Y,
         (query->__Pos).Z,query->floorz,query->ceilingz);
  dVar1 = query->Speed;
  dVar2 = (query->Vel).X;
  dVar3 = (query->Vel).Y;
  dVar4 = (query->Vel).Z;
  dVar9 = c_sqrt(dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3);
  Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",dVar1,dVar2,dVar3,dVar4,dVar9);
  Printf("Scale: x:%f, y:%f\n",(query->Scale).X,(query->Scale).Y);
  return;
}

Assistant:

void PrintMiscActorInfo(AActor *query)
{
	if (query)
	{
		int flagi;
		int querystyle = STYLE_Count;
		for (int style = STYLE_None; style < STYLE_Count; ++style)
		{ // Check for a legacy render style that matches.
			if (LegacyRenderStyles[style] == query->RenderStyle)
			{
				querystyle = style;
				break;
			}
		}
		static const char * renderstyles[]= {"None", "Normal", "Fuzzy", "SoulTrans",
			"OptFuzzy", "Stencil", "Translucent", "Add", "Shaded", "TranslucentStencil",
			"Shadow", "Subtract", "AddStencil", "AddShaded"};

		FLineSpecial *spec = P_GetLineSpecialInfo(query->special);

		Printf("%s @ %p has the following flags:\n   flags: %x", query->GetTag(), query, query->flags.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags & ActorFlags::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags));
		Printf("\n   flags2: %x", query->flags2.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags2 & ActorFlags2::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags2));
		Printf("\n   flags3: %x", query->flags3.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags3 & ActorFlags3::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags3));
		Printf("\n   flags4: %x", query->flags4.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags4 & ActorFlags4::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags4));
		Printf("\n   flags5: %x", query->flags5.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags5 & ActorFlags5::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags5));
		Printf("\n   flags6: %x", query->flags6.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags6 & ActorFlags6::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags6));
		Printf("\n   flags7: %x", query->flags7.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags7 & ActorFlags7::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags7));
		Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f", 
			query->BounceFlags.GetValue(), query->bouncefactor,
			query->wallbouncefactor);
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->BounceFlags & 1<<flagi) Printf(" %s", flagnamesb[flagi]);*/
		Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x", 
			querystyle, (querystyle < STYLE_Count ? renderstyles[querystyle] : "Unknown"),
			query->Alpha, query->renderflags.GetValue());
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->renderflags & 1<<flagi) Printf(" %s", flagnamesr[flagi]);*/
		Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",
			(spec ? spec->name : "None"),
			query->args[0], query->args[1], query->args[2], query->args[3], 
			query->args[4],	query->special1, query->special2);
		Printf("\nTID: %d", query->tid);
		Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",
			query->X(), query->Y(), query->Z(),
			query->floorz, query->ceilingz);
		Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",
			query->Speed, query->Vel.X, query->Vel.Y, query->Vel.Z, query->Vel.Length());
		Printf("Scale: x:%f, y:%f\n", query->Scale.X, query->Scale.Y);
	}
}